

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# alp_compress.hpp
# Opt level: O2

void __thiscall duckdb::AlpCompressionState<double>::FlushVector(AlpCompressionState<double> *this)

{
  ushort uVar1;
  data_ptr_t pdVar2;
  uint uVar3;
  uint64_t uVar4;
  long lVar5;
  
  *this->data_ptr = (this->state).vector_encoding_indices.exponent;
  pdVar2 = this->data_ptr;
  this->data_ptr = pdVar2 + 1;
  pdVar2[1] = (this->state).vector_encoding_indices.factor;
  pdVar2 = this->data_ptr;
  this->data_ptr = pdVar2 + 1;
  *(uint16_t *)(pdVar2 + 1) = (this->state).exceptions_count;
  pdVar2 = this->data_ptr;
  this->data_ptr = pdVar2 + 2;
  *(uint64_t *)(pdVar2 + 2) = (this->state).frame_of_reference;
  pdVar2 = this->data_ptr;
  this->data_ptr = pdVar2 + 8;
  pdVar2[8] = (data_t)(this->state).bit_width;
  pdVar2 = this->data_ptr;
  this->data_ptr = pdVar2 + 1;
  switchD_01939fa4::default(pdVar2 + 1,(this->state).values_encoded,(this->state).bp_size);
  uVar4 = (this->state).bp_size;
  pdVar2 = this->data_ptr;
  this->data_ptr = pdVar2 + uVar4;
  uVar1 = (this->state).exceptions_count;
  if (uVar1 == 0) {
    lVar5 = 0;
  }
  else {
    switchD_01939fa4::default(pdVar2 + uVar4,(this->state).exceptions,(ulong)uVar1 << 3);
    uVar1 = (this->state).exceptions_count;
    pdVar2 = this->data_ptr;
    this->data_ptr = pdVar2 + (uint)uVar1 * 8;
    switchD_01939fa4::default
              (pdVar2 + (uint)uVar1 * 8,(this->state).exceptions_positions,(ulong)((uint)uVar1 * 2))
    ;
    uVar1 = (this->state).exceptions_count;
    lVar5 = (ulong)uVar1 * 10;
    this->data_ptr = this->data_ptr + (uint)uVar1 * 2;
    uVar4 = (this->state).bp_size;
  }
  this->data_bytes_used = uVar4 + this->data_bytes_used + lVar5 + 0xd;
  pdVar2 = this->metadata_ptr;
  this->metadata_ptr = pdVar2 + -4;
  *(uint32_t *)(pdVar2 + -4) = this->next_vector_byte_index_start;
  uVar3 = NumericCastImpl<unsigned_int,_unsigned_long,_false>::Convert(this->data_bytes_used + 4);
  this->next_vector_byte_index_start = uVar3;
  this->vectors_flushed = this->vectors_flushed + 1;
  (this->state).vector_encoding_indices.exponent = '\0';
  (this->state).vector_encoding_indices.factor = '\0';
  (this->state).exceptions_count = 0;
  (this->state).bit_width = 0;
  this->vector_idx = 0;
  this->nulls_idx = 0;
  return;
}

Assistant:

void FlushVector() {
		Store<uint8_t>(state.vector_encoding_indices.exponent, data_ptr);
		data_ptr += AlpConstants::EXPONENT_SIZE;

		Store<uint8_t>(state.vector_encoding_indices.factor, data_ptr);
		data_ptr += AlpConstants::FACTOR_SIZE;

		Store<uint16_t>(state.exceptions_count, data_ptr);
		data_ptr += AlpConstants::EXCEPTIONS_COUNT_SIZE;

		Store<uint64_t>(state.frame_of_reference, data_ptr);
		data_ptr += AlpConstants::FOR_SIZE;

		Store<uint8_t>(UnsafeNumericCast<uint8_t>(state.bit_width), data_ptr);
		data_ptr += AlpConstants::BIT_WIDTH_SIZE;

		memcpy((void *)data_ptr, (void *)state.values_encoded, state.bp_size);
		// We should never go out of bounds in the values_encoded array
		D_ASSERT((AlpConstants::ALP_VECTOR_SIZE * 8) >= state.bp_size);

		data_ptr += state.bp_size;

		if (state.exceptions_count > 0) {
			memcpy((void *)data_ptr, (void *)state.exceptions, sizeof(EXACT_TYPE) * state.exceptions_count);
			data_ptr += sizeof(EXACT_TYPE) * state.exceptions_count;
			memcpy((void *)data_ptr, (void *)state.exceptions_positions,
			       AlpConstants::EXCEPTION_POSITION_SIZE * state.exceptions_count);
			data_ptr += AlpConstants::EXCEPTION_POSITION_SIZE * state.exceptions_count;
		}

		data_bytes_used += state.bp_size +
		                   (state.exceptions_count * (sizeof(EXACT_TYPE) + AlpConstants::EXCEPTION_POSITION_SIZE)) +
		                   AlpConstants::EXPONENT_SIZE + AlpConstants::FACTOR_SIZE +
		                   AlpConstants::EXCEPTIONS_COUNT_SIZE + AlpConstants::FOR_SIZE + AlpConstants::BIT_WIDTH_SIZE;

		// Write pointer to the vector data (metadata)
		metadata_ptr -= sizeof(uint32_t);
		Store<uint32_t>(next_vector_byte_index_start, metadata_ptr);
		next_vector_byte_index_start = NumericCast<uint32_t>(UsedSpace());

		vectors_flushed++;
		vector_idx = 0;
		nulls_idx = 0;
		ResetVector();
	}